

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

uint __thiscall ON_Brep::SizeOf(ON_Brep *this)

{
  ON_Curve *pOVar1;
  ON_Surface *pOVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  
  uVar3 = ON_Object::SizeOf((ON_Object *)this);
  iVar10 = uVar3 + ((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity +
                    (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity +
                   (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity) * 8 + 0x128;
  lVar11 = (long)(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (0 < lVar11) {
    lVar9 = 0;
    do {
      pOVar1 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar9];
      if (pOVar1 != (ON_Curve *)0x0) {
        iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
        iVar10 = iVar10 + iVar4;
      }
      lVar9 = lVar9 + 1;
    } while (lVar11 != lVar9);
  }
  lVar11 = (long)(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (0 < lVar11) {
    lVar9 = 0;
    do {
      pOVar1 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar9];
      if (pOVar1 != (ON_Curve *)0x0) {
        iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
        iVar10 = iVar10 + iVar4;
      }
      lVar9 = lVar9 + 1;
    } while (lVar11 != lVar9);
  }
  lVar11 = (long)(this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  if (0 < lVar11) {
    lVar9 = 0;
    do {
      pOVar2 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar9];
      if (pOVar2 != (ON_Surface *)0x0) {
        iVar4 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
        iVar10 = iVar10 + iVar4;
      }
      lVar9 = lVar9 + 1;
    } while (lVar11 != lVar9);
  }
  uVar3 = ON_BrepVertexArray::SizeOf(&this->m_V);
  uVar5 = ON_BrepEdgeArray::SizeOf(&this->m_E);
  uVar6 = ON_BrepTrimArray::SizeOf(&this->m_T);
  uVar7 = ON_BrepLoopArray::SizeOf(&this->m_L);
  uVar8 = ON_BrepFaceArray::SizeOf(&this->m_F);
  return uVar8 + uVar7 + uVar6 + uVar5 + uVar3 + iVar10;
}

Assistant:

unsigned int ON_Brep::SizeOf() const
{
  int i, count;

  unsigned int sz = ON_Geometry::SizeOf();
  sz += (sizeof(*this) - sizeof(ON_Geometry));
  sz += m_C2.SizeOfArray();
  sz += m_C3.SizeOfArray();
  sz += m_S.SizeOfArray();

  count = m_C2.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Curve* c2 = m_C2[i];
    if ( c2 )
      sz += c2->SizeOf();
  }

  count = m_C3.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Curve* c3 = m_C3[i];
    if ( c3 )
      sz += c3->SizeOf();
  }

  count = m_S.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Surface* s = m_S[i];
    if ( s )
      sz += s->SizeOf();
  }

  sz += m_V.SizeOf();
  sz += m_E.SizeOf();
  sz += m_T.SizeOf();
  sz += m_L.SizeOf();
  sz += m_F.SizeOf();

  return sz;
}